

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_local_value.hpp
# Opt level: O2

double __thiscall
ylt::metric::thread_local_value<double>::update(thread_local_value<double> *this,double value)

{
  atomic<double> aVar1;
  pointer paVar2;
  __base_type _Var3;
  size_t i;
  atomic<double> *paVar4;
  ulong uVar5;
  double dVar6;
  
  paVar4 = get_value(this,0);
  LOCK();
  dVar6 = (paVar4->super___atomic_float<double>)._M_fp;
  (paVar4->super___atomic_float<double>)._M_fp = value;
  UNLOCK();
  uVar5 = 1;
  while( true ) {
    paVar2 = (this->duplicates_).
             super__Vector_base<std::atomic<std::atomic<double>_*>,_std::allocator<std::atomic<std::atomic<double>_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->duplicates_).
                      super__Vector_base<std::atomic<std::atomic<double>_*>,_std::allocator<std::atomic<std::atomic<double>_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)paVar2 >> 3) <= uVar5)
    break;
    if (paVar2[uVar5]._M_b._M_p != (__pointer_type)0x0) {
      _Var3._M_p = (this->duplicates_).
                   super__Vector_base<std::atomic<std::atomic<double>_*>,_std::allocator<std::atomic<std::atomic<double>_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_b._M_p;
      LOCK();
      aVar1.super___atomic_float<double>._M_fp = (_Var3._M_p)->super___atomic_float<double>;
      (_Var3._M_p)->super___atomic_float<double> = (__atomic_float<double>)0x0;
      UNLOCK();
      dVar6 = dVar6 + (double)aVar1.super___atomic_float<double>._M_fp;
    }
    uVar5 = uVar5 + 1;
  }
  return dVar6;
}

Assistant:

value_type update(value_type value = 1) {
    value_type val = get_value(0).exchange(value, std::memory_order::relaxed);
    for (size_t i = 1; i < duplicates_.size(); i++) {
      if (duplicates_[i]) {
        val += duplicates_[i].load()->exchange(0, std::memory_order::relaxed);
      }
    }
    return val;
  }